

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictVectorizer.pb.h
# Opt level: O0

Int64Vector * __thiscall
CoreML::Specification::DictVectorizer::mutable_int64toindex(DictVectorizer *this)

{
  bool bVar1;
  Int64Vector *this_00;
  DictVectorizer *this_local;
  
  bVar1 = has_int64toindex(this);
  if (!bVar1) {
    clear_Map(this);
    set_has_int64toindex(this);
    this_00 = (Int64Vector *)operator_new(0x28);
    Int64Vector::Int64Vector(this_00);
    (this->Map_).int64toindex_ = this_00;
  }
  return (Int64Vector *)(this->Map_).stringtoindex_;
}

Assistant:

inline ::CoreML::Specification::Int64Vector* DictVectorizer::mutable_int64toindex() {
  if (!has_int64toindex()) {
    clear_Map();
    set_has_int64toindex();
    Map_.int64toindex_ = new ::CoreML::Specification::Int64Vector;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.DictVectorizer.int64ToIndex)
  return Map_.int64toindex_;
}